

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadOptionalDouble
          (TextReader<fmt::Locale> *this,double *value)

{
  char *__nptr;
  bool bVar1;
  double dVar2;
  char *end;
  char *local_20;
  
  SkipSpace(this);
  __nptr = (this->super_ReaderBase).ptr_;
  if (*__nptr == '\n') {
    bVar1 = false;
  }
  else {
    local_20 = (char *)0x0;
    dVar2 = strtod(__nptr,&local_20);
    *value = dVar2;
    bVar1 = (this->super_ReaderBase).ptr_ != local_20;
    (this->super_ReaderBase).ptr_ = local_20;
  }
  return bVar1;
}

Assistant:

bool mp::internal::TextReader<Locale>::ReadOptionalDouble(double &value) {
  SkipSpace();
  if (*ptr_ == '\n')
    return false;
  char *end = 0;
  value = std::strtod(ptr_, &end);
  bool has_value = ptr_ != end;
  ptr_ = end;
  return has_value;
}